

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::CFLPredictTest_PredictTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CFLPredictTest_PredictTest_Test> *this)

{
  CFLPredictTest *this_00;
  
  WithParamInterface<std::tuple<unsigned_char,void(*(*)(unsigned_char))(short_const*,unsigned_char*,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (CFLPredictTest *)operator_new(0x68);
  anon_unknown.dwarf_2d0ac2::CFLPredictTest::CFLPredictTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_char_*,_int,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__CFLPredictTest_00ee9128;
  (this_00->
  super_TestWithParam<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_char_*,_int,_int)>_>
  ).
  super_WithParamInterface<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_char_*,_int,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_00ee9168;
  (this_00->super_CFLTestWithAlignedData<unsigned_char>).super_CFLTest._vptr_CFLTest =
       (_func_int **)&PTR__CFLPredictTest_PredictTest_Test_00ee9188;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }